

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::UniformGridMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          UniformGridMediumProvider *this,Allocator alloc,Point3i *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001384 [12];
  anon_class_8_1_8991fb9c getMaxDensity;
  Bounds3f bounds;
  anon_class_8_1_8991fb9c local_78;
  Bounds3f local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (float *)SUB168(ZEXT816(0) << 0x40,0);
  __return_storage_ptr__->nAlloc = SUB168(ZEXT816(0) << 0x40,8);
  (res->super_Tuple3<pbrt::Point3,_int>).x = 4;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 4;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 4;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize(__return_storage_ptr__,0x40)
  ;
  iVar4 = (res->super_Tuple3<pbrt::Point3,_int>).z;
  if (0 < iVar4) {
    iVar6 = 0;
    iVar8 = 0;
    iVar3 = (res->super_Tuple3<pbrt::Point3,_int>).y;
    local_78.this = this;
    do {
      if (0 < iVar3) {
        uVar5 = (res->super_Tuple3<pbrt::Point3,_int>).x;
        iVar4 = 0;
        do {
          if (0 < (int)uVar5) {
            local_48._0_4_ = (undefined4)iVar4;
            local_48._4_12_ = in_register_00001384;
            lVar7 = 0;
            local_58._0_4_ = (undefined4)(iVar4 + 1);
            local_58._4_12_ = in_register_00001384;
            do {
              auVar10._0_4_ = (float)(int)lVar7;
              auVar10._4_12_ = in_register_00001384;
              auVar1 = vinsertps_avx(auVar10,ZEXT416((uint)local_48._0_4_),0x10);
              fVar11 = (float)(res->super_Tuple3<pbrt::Point3,_int>).z;
              auVar14._0_4_ = (float)((int)lVar7 + 1);
              auVar14._4_12_ = in_register_00001384;
              auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)local_58._0_4_),0x10);
              auVar13._0_4_ = (float)iVar6 / fVar11;
              auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar12 = ZEXT416((uint)((float)(iVar6 + 1) / fVar11));
              auVar10 = vpinsrd_avx(ZEXT416(uVar5),(res->super_Tuple3<pbrt::Point3,_int>).y,1);
              auVar10 = vcvtdq2ps_avx(auVar10);
              auVar1 = vdivps_avx(auVar1,auVar10);
              auVar10 = vdivps_avx(auVar14,auVar10);
              auVar2 = vminss_avx(auVar12,auVar13);
              auVar14 = vmaxss_avx(auVar12,auVar13);
              auVar12 = vminps_avx(auVar10,auVar1);
              auVar10 = vmaxps_avx(auVar10,auVar1);
              local_70.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar12);
              local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar2._0_4_;
              local_70.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar10);
              local_70.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar14._0_4_;
              FVar9 = GetMaxDensityGrid::anon_class_8_1_8991fb9c::operator()(&local_78,&local_70);
              __return_storage_ptr__->ptr[iVar8 + lVar7] = FVar9;
              lVar7 = lVar7 + 1;
              uVar5 = (res->super_Tuple3<pbrt::Point3,_int>).x;
            } while ((int)lVar7 < (int)uVar5);
            iVar3 = (res->super_Tuple3<pbrt::Point3,_int>).y;
            iVar8 = iVar8 + (int)lVar7;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < iVar3);
        iVar4 = (res->super_Tuple3<pbrt::Point3,_int>).z;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < iVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
        pstd::vector<Float> maxGrid(alloc);
        // Set _gridResolution_ and allocate _maxGrid_
        *res = Point3i(4, 4, 4);
        maxGrid.resize(res->x * res->y * res->z);

        // Define _getMaxDensity_ lambda
        auto getMaxDensity = [&](const Bounds3f &bounds) -> Float {
            if (densityGrid)
                return densityGrid->MaximumValue(bounds);
            else {
                // Compute maximum density of RGB density over _bounds_
                int nx = rgbDensityGrid->xSize();
                int ny = rgbDensityGrid->ySize();
                int nz = rgbDensityGrid->zSize();
                Point3f ps[2] = {
                    Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                            bounds.pMin.z * nz - .5f),
                    Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                            bounds.pMax.z * nz - .5f)};
                Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                                 Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                                     Point3i(nx - 1, ny - 1, nz - 1))};

                std::vector<SampledWavelengths> lambdas;
                for (Float u : Stratified1D(16))
                    lambdas.push_back(SampledWavelengths::SampleXYZ(u));

                Float maxDensity = 0;
                for (int z = pi[0].z; z <= pi[1].z; ++z)
                    for (int y = pi[0].y; y <= pi[1].y; ++y)
                        for (int x = pi[0].x; x <= pi[1].x; ++x) {
                            RGB rgb = rgbDensityGrid->Lookup(Point3i(x, y, z));

                            Float maxComponent = std::max({rgb.r, rgb.g, rgb.b});
                            if (maxComponent == 0)
                                continue;

                            RGBSpectrum spec(*colorSpace, rgb);
                            for (const SampledWavelengths &lambda : lambdas) {
                                SampledSpectrum s = spec.Sample(lambda);
                                maxDensity = std::max(maxDensity, s.MaxComponentValue());
                            }
                        }

                return maxDensity * 1.025f;
            }
        };

        // Compute maximum density for each _maxGrid_ cell
        int offset = 0;
        for (int z = 0; z < res->z; ++z)
            for (int y = 0; y < res->y; ++y)
                for (int x = 0; x < res->x; ++x) {
                    Bounds3f bounds(
                        Point3f(Float(x) / res->x, Float(y) / res->y, Float(z) / res->z),
                        Point3f(Float(x + 1) / res->x, Float(y + 1) / res->y,
                                Float(z + 1) / res->z));
                    maxGrid[offset++] = getMaxDensity(bounds);
                }

        return maxGrid;
    }